

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_static.c
# Opt level: O3

char * zip_name_normalize(char *name,char *nname,size_t len)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  
  if (len == 0 || (nname == (char *)0x0 || name == (char *)0x0)) {
    return (char *)0x0;
  }
  for (; (cVar3 = *name, cVar3 == '/' || (cVar3 == '\\')); name = name + 1) {
  }
  lVar4 = 0;
  lVar2 = 0;
  do {
    if ((cVar3 == '/') || (cVar3 == '\\')) {
      if (lVar2 != 0) {
        lVar5 = 0;
        do {
          if (nname[lVar5 + lVar4] != '.') {
            lVar5 = lVar2 + lVar4;
            lVar4 = lVar4 + lVar2 + 1;
            nname[lVar5] = cVar3;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar2 != lVar5);
      }
      lVar2 = 0;
    }
    else {
      if (cVar3 == '\0') break;
      nname[lVar2 + lVar4] = cVar3;
      lVar2 = lVar2 + 1;
    }
    name = name + 1;
    cVar3 = *name;
  } while( true );
  pcVar1 = nname + lVar4;
  if (lVar2 != 0) {
    lVar4 = 0;
    do {
      if (pcVar1[lVar4] != '.') {
        pcVar1 = pcVar1 + lVar2;
        break;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  *pcVar1 = '\0';
  return nname;
}

Assistant:

static char *zip_name_normalize(char *name, char *const nname, size_t len) {
  size_t offn = 0, ncpy = 0;
  char c;

  if (name == NULL || nname == NULL || len <= 0) {
    return NULL;
  }
  // skip trailing '/'
  while (ISSLASH(*name)) {
    name++;
  }

  while ((c = *name++)) {
    if (ISSLASH(c)) {
      if (ncpy > 0 && !zip_strchr_match(&nname[offn], ncpy, '.')) {
        offn += ncpy;
        nname[offn++] = c; // append '/'
      }
      ncpy = 0;
    } else {
      nname[offn + ncpy] = c;
      if (c) {
        ncpy++;
      }
    }
  }

  if (!zip_strchr_match(&nname[offn], ncpy, '.')) {
    nname[offn + ncpy] = '\0';
  } else {
    nname[offn] = '\0';
  }

  return nname;
}